

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  uint8_t uVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  array_container_t *paVar5;
  _Bool _Var6;
  uint uVar7;
  uint32_t uVar8;
  byte local_74;
  bool local_73;
  uint local_5c;
  uint32_t i_1;
  uint32_t largest_run_value;
  uint32_t i;
  bitset_container_t *bcont;
  run_container_t *rcont;
  array_container_t *acont;
  uint64_t word;
  uint32_t wordindex;
  uint32_t num_values;
  uint32_t ret;
  uint32_t count_local;
  uint32_t *buf_local;
  roaring_uint32_iterator_t *it_local;
  
  wordindex = 0;
  _ret = buf;
  while( true ) {
    if ((it->has_value & 1U) == 0 || count <= wordindex) {
      return wordindex;
    }
    uVar1 = it->typecode;
    if (uVar1 == '\x01') {
      pvVar2 = it->container;
      word._0_4_ = it->in_container_index / 0x40;
      acont = (array_container_t *)
              (*(ulong *)(*(long *)((long)pvVar2 + 8) + (ulong)(uint)word * 8) &
              -1L << ((byte)((long)it->in_container_index % 0x40) & 0x3f));
      do {
        for (; acont != (array_container_t *)0x0 && wordindex < count;
            acont = (array_container_t *)((ulong)acont & (ulong)((long)&acont[-1].array + 7U))) {
          iVar4 = 0;
          for (paVar5 = acont; ((ulong)paVar5 & 1) == 0;
              paVar5 = (array_container_t *)((ulong)paVar5 >> 1 | 0x8000000000000000)) {
            iVar4 = iVar4 + 1;
          }
          *_ret = it->highbits | (uint)word * 0x40 + iVar4;
          _ret = _ret + 1;
          wordindex = wordindex + 1;
        }
        while (acont == (array_container_t *)0x0 && (uint)word + 1 < 0x400) {
          word._0_4_ = (uint)word + 1;
          acont = *(array_container_t **)(*(long *)((long)pvVar2 + 8) + (ulong)(uint)word * 8);
        }
        local_73 = acont != (array_container_t *)0x0 && wordindex < count;
      } while (local_73);
      it->has_value = acont != (array_container_t *)0x0;
      if ((it->has_value & 1U) != 0) {
        iVar4 = 0;
        for (; ((ulong)acont & 1) == 0;
            acont = (array_container_t *)((ulong)acont >> 1 | 0x8000000000000000)) {
          iVar4 = iVar4 + 1;
        }
        it->in_container_index = (uint)word * 0x40 + iVar4;
        it->current_value = it->highbits | it->in_container_index;
      }
    }
    else if (uVar1 == '\x02') {
      piVar3 = (int *)it->container;
      uVar8 = minimum_uint32(*piVar3 - it->in_container_index,count - wordindex);
      for (i_1 = 0; i_1 < uVar8; i_1 = i_1 + 1) {
        _ret[i_1] = it->highbits |
                    (uint)*(ushort *)
                           (*(long *)(piVar3 + 2) + (ulong)(it->in_container_index + i_1) * 2);
      }
      _ret = _ret + uVar8;
      wordindex = uVar8 + wordindex;
      it->in_container_index = uVar8 + it->in_container_index;
      it->has_value = it->in_container_index < *piVar3;
      if ((it->has_value & 1U) != 0) {
        it->current_value =
             it->highbits |
             (uint)*(ushort *)(*(long *)(piVar3 + 2) + (long)it->in_container_index * 2);
      }
    }
    else {
      if (uVar1 != '\x03') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x41b3,
                      "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
                     );
      }
      piVar3 = (int *)it->container;
      do {
        uVar7 = it->highbits |
                (uint)*(ushort *)(*(long *)(piVar3 + 2) + (long)it->run_index * 4) +
                (uint)*(ushort *)(*(long *)(piVar3 + 2) + 2 + (long)it->run_index * 4);
        uVar8 = minimum_uint32((uVar7 - it->current_value) + 1,count - wordindex);
        for (local_5c = 0; local_5c < uVar8; local_5c = local_5c + 1) {
          _ret[local_5c] = it->current_value + local_5c;
        }
        it->current_value = uVar8 + it->current_value;
        _ret = _ret + uVar8;
        wordindex = uVar8 + wordindex;
        if ((uVar7 < it->current_value) || (it->current_value == 0)) {
          it->run_index = it->run_index + 1;
          if (it->run_index < *piVar3) {
            it->current_value =
                 it->highbits | (uint)*(ushort *)(*(long *)(piVar3 + 2) + (long)it->run_index * 4);
          }
          else {
            it->has_value = false;
          }
        }
        local_74 = 0;
        if (wordindex < count) {
          local_74 = it->has_value;
        }
      } while ((local_74 & 1) != 0);
    }
    if ((it->has_value & 1U) != 0) break;
    it->container_index = it->container_index + 1;
    _Var6 = loadfirstvalue(it);
    it->has_value = _Var6;
  }
  if (wordindex == count) {
    return wordindex;
  }
  __assert_fail("ret == count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x41b6,
                "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
               );
}

Assistant:

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it, uint32_t* buf, uint32_t count) {
  uint32_t ret = 0;
  uint32_t num_values;
  uint32_t wordindex;  // used for bitsets
  uint64_t word;       // used for bitsets
  const array_container_t* acont; //TODO remove
  const run_container_t* rcont; //TODO remove
  const bitset_container_t* bcont; //TODO remove

  while (it->has_value && ret < count) {
    switch (it->typecode) {
      case BITSET_CONTAINER_TYPE:
        bcont = const_CAST_bitset(it->container);
        wordindex = it->in_container_index / 64;
        word = bcont->words[wordindex] & (UINT64_MAX << (it->in_container_index % 64));
        do {
          while (word != 0 && ret < count) {
            buf[0] = it->highbits | (wordindex * 64 + __builtin_ctzll(word));
            word = word & (word - 1);
            buf++;
            ret++;
          }
          while (word == 0 && wordindex+1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
            wordindex++;
            word = bcont->words[wordindex];
          }
        } while (word != 0 && ret < count);
        it->has_value = (word != 0);
        if (it->has_value) {
          it->in_container_index = wordindex * 64 + __builtin_ctzll(word);
          it->current_value = it->highbits | it->in_container_index;
        }
        break;
      case ARRAY_CONTAINER_TYPE:
        acont = const_CAST_array(it->container);
        num_values = minimum_uint32(acont->cardinality - it->in_container_index, count - ret);
        for (uint32_t i = 0; i < num_values; i++) {
          buf[i] = it->highbits | acont->array[it->in_container_index + i];
        }
        buf += num_values;
        ret += num_values;
        it->in_container_index += num_values;
        it->has_value = (it->in_container_index < acont->cardinality);
        if (it->has_value) {
          it->current_value = it->highbits | acont->array[it->in_container_index];
        }
        break;
      case RUN_CONTAINER_TYPE:
        rcont = const_CAST_run(it->container);
        //"in_run_index" name is misleading, read it as "max_value_in_current_run"
        do {
          uint32_t largest_run_value = it->highbits | (rcont->runs[it->run_index].value + rcont->runs[it->run_index].length);
          num_values = minimum_uint32(largest_run_value - it->current_value + 1, count - ret);
          for (uint32_t i = 0; i < num_values; i++) {
            buf[i] = it->current_value + i;
          }
          it->current_value += num_values; // this can overflow to zero: UINT32_MAX+1=0
          buf += num_values;
          ret += num_values;

          if (it->current_value > largest_run_value || it->current_value == 0) {
            it->run_index++;
            if (it->run_index < rcont->n_runs) {
              it->current_value = it->highbits | rcont->runs[it->run_index].value;
            } else {
              it->has_value = false;
            }
          }
        } while ((ret < count) && it->has_value);
        break;
      default:
        assert(false);
    }
    if (it->has_value) {
      assert(ret == count);
      return ret;
    }
    it->container_index++;
    it->has_value = loadfirstvalue(it);
  }
  return ret;
}